

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O2

void __thiscall
cppcms::sessions::session_file_storage::~session_file_storage(session_file_storage *this)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  (this->super_session_storage)._vptr_session_storage = (_func_int **)&PTR_save_002b9140;
  if (this->memory_ == (void *)0xffffffffffffffff) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < this->lock_size_; uVar2 = uVar2 + 1) {
      pthread_mutex_destroy
                ((pthread_mutex_t *)
                 ((long)(this->mutexes_).
                        super__Vector_base<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar1));
      lVar1 = lVar1 + 0x28;
    }
  }
  else {
    lVar1 = 0;
    uVar2 = 0;
    while( true ) {
      if (this->lock_size_ <= uVar2) break;
      pthread_mutex_destroy((pthread_mutex_t *)((long)this->memory_ + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x28;
    }
    munmap(this->memory_,(ulong)this->lock_size_ * 0x28);
  }
  std::_Vector_base<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>::~_Vector_base
            (&(this->mutexes_).super__Vector_base<pthread_mutex_t,_std::allocator<pthread_mutex_t>_>
            );
  std::__cxx11::string::~string((string *)&this->path_);
  booster::hold_ptr<cppcms::sessions::session_file_storage::_data>::~hold_ptr(&this->d);
  return;
}

Assistant:

session_file_storage::~session_file_storage()
{
	if(memory_ !=MAP_FAILED) {
		for(unsigned i=0;i<lock_size_;i++)
			destroy_mutex(reinterpret_cast<pthread_mutex_t *>(memory_) + i);
		munmap((char*)memory_,sizeof(pthread_mutex_t) * lock_size_);
	}
	else {
		for(unsigned i=0;i<lock_size_;i++)
			destroy_mutex(&mutexes_[i]);
	}
}